

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  long *plVar2;
  
  if (((this->m_configData).waitForKeypress & BeforeStart) != Never) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"...waiting for enter/ return before starting",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    getchar();
  }
  iVar1 = runInternal(this);
  if (((this->m_configData).waitForKeypress & BeforeExit) != Never) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"...waiting for enter/ return before exiting, with code: ",0x38
              );
    plVar2 = (long *)std::ostream::operator<<(&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    getchar();
  }
  return iVar1;
}

Assistant:

int Session::run() {
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeStart ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before starting" << std::endl;
            static_cast<void>(std::getchar());
        }
        int exitCode = runInternal();
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeExit ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before exiting, with code: " << exitCode << std::endl;
            static_cast<void>(std::getchar());
        }
        return exitCode;
    }